

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
~basic_json_encoder(basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
                    *this)

{
  ~basic_json_encoder(this);
  operator_delete(this,0x278);
  return;
}

Assistant:

~basic_json_encoder() noexcept
        {
            JSONCONS_TRY
            {
                sink_.flush();
            }